

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_const_unsigned_int,_int>
* __thiscall
fmt::v7::make_args_checked<unsigned_int_const&,unsigned_int_const&,int,char[13],char>
          (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_const_unsigned_int,_int>
           *__return_storage_ptr__,v7 *this,char (*format_str) [13],
          remove_reference_t<const_unsigned_int_&> *args,
          remove_reference_t<const_unsigned_int_&> *args_1,remove_reference_t<int> *args_2)

{
  remove_reference_t<int> *args_local_2;
  remove_reference_t<const_unsigned_int_&> *args_local_1;
  remove_reference_t<const_unsigned_int_&> *args_local;
  char (*format_str_local) [13];
  
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_const_unsigned_int,_int>
  ::format_arg_store(__return_storage_ptr__,(uint *)format_str,args,(int *)args_1);
  return __return_storage_ptr__;
}

Assistant:

inline auto make_args_checked(const S& format_str,
                              const remove_reference_t<Args>&... args)
    -> format_arg_store<buffer_context<Char>, remove_reference_t<Args>...> {
  static_assert(
      detail::count<(
              std::is_base_of<detail::view, remove_reference_t<Args>>::value &&
              std::is_reference<Args>::value)...>() == 0,
      "passing views as lvalues is disallowed");
  detail::check_format_string<Args...>(format_str);
  return {args...};
}